

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

pointer __thiscall
google::
dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
::
alloc_impl<google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
::realloc_or_die(alloc_impl<google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                 *this,pointer ptr,size_type n)

{
  dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
  *this_00;
  bool bVar1;
  pointer ppVar2;
  undefined7 extraout_var;
  
  ppVar2 = (pointer)realloc(ptr,n << 4);
  if (ppVar2 != (pointer)0x0) {
    return ppVar2;
  }
  dense_hashtable<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>,char,std::hash<char>,google::dense_hash_map<char,std::vector<CMString,std::allocator<CMString>>*,std::hash<char>,std::equal_to<char>,google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>::SelectKey,google::dense_hash_map<char,std::vector<CMString,std::allocator<CMString>>*,std::hash<char>,std::equal_to<char>,google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>::SetKey,std::equal_to<char>,google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>
  ::
  alloc_impl<google::libc_allocator_with_realloc<std::pair<char_const,std::vector<CMString,std::allocator<CMString>>*>>>
  ::realloc_or_die();
  ppVar2 = ((const_iterator *)n)->pos;
  if (ppVar2 != ((const_iterator *)n)->end) {
    do {
      this_00 = ((const_iterator *)n)->ht;
      if ((this_00->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
          use_empty_ == false) {
        __assert_fail("settings.use_empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/sparsehash/src/sparsehash/internal/densehashtable.h"
                      ,0x1e4,
                      "bool google::dense_hashtable<std::pair<const char, std::vector<CMString> *>, char, std::hash<char>, google::dense_hash_map<char, std::vector<CMString> *>::SelectKey, google::dense_hash_map<char, std::vector<CMString> *>::SetKey, std::equal_to<char>, google::libc_allocator_with_realloc<std::pair<const char, std::vector<CMString> *>>>::test_empty(const const_iterator &) const [Value = std::pair<const char, std::vector<CMString> *>, Key = char, HashFcn = std::hash<char>, ExtractKey = google::dense_hash_map<char, std::vector<CMString> *>::SelectKey, SetKey = google::dense_hash_map<char, std::vector<CMString> *>::SetKey, EqualKey = std::equal_to<char>, Alloc = google::libc_allocator_with_realloc<std::pair<const char, std::vector<CMString> *>>]"
                     );
      }
      if ((this_00->val_info).emptyval.first != ppVar2->first) {
        bVar1 = test_deleted(this_00,(const_iterator *)n);
        if (!bVar1) {
          return (pointer)CONCAT71(extraout_var,bVar1);
        }
      }
      ppVar2 = ((const_iterator *)n)->pos + 1;
      ((const_iterator *)n)->pos = ppVar2;
    } while (ppVar2 != ((const_iterator *)n)->end);
  }
  return ppVar2;
}

Assistant:

pointer realloc_or_die(pointer ptr, size_type n) {
      pointer retval = this->reallocate(ptr, n);
      if (retval == NULL) {
        fprintf(stderr,
                "sparsehash: FATAL ERROR: failed to reallocate "
                "%lu elements for ptr %p",
                static_cast<unsigned long>(n), static_cast<void*>(ptr));
        exit(1);
      }
      return retval;
    }